

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckArea(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint code;
  AttVal *pAVar4;
  
  pAVar4 = node->attributes;
  if (pAVar4 == (AttVal *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
    do {
      uVar1 = (doc->access).PRIORITYCHK;
      if ((((0xfffffffc < uVar1 - 4) && (pAVar4->dict != (Attribute *)0x0)) &&
          (pAVar4->dict->id == TidyAttr_ALT)) && (pAVar4->value != (tmbstr)0x0)) {
        bVar2 = true;
      }
      if ((((uVar1 & 0xfffffffe) == 2) && (pAVar4->dict != (Attribute *)0x0)) &&
         ((pAVar4->dict->id == TidyAttr_TARGET && (pAVar4->value != (ctmbstr)0x0)))) {
        iVar3 = prvTidytmbstrcasecmp(pAVar4->value,"_new");
        if (iVar3 == 0) {
          code = 0x2f2;
LAB_0015408d:
          prvTidyReportAccessError(doc,node,code);
        }
        else if (pAVar4->value != (ctmbstr)0x0) {
          iVar3 = prvTidytmbstrcasecmp(pAVar4->value,"_blank");
          if (iVar3 == 0) {
            code = 0x2f3;
            goto LAB_0015408d;
          }
        }
      }
      pAVar4 = pAVar4->next;
    } while (pAVar4 != (AttVal *)0x0);
    bVar2 = !bVar2;
  }
  if (((doc->access).PRIORITYCHK - 1U < 3) && (bVar2)) {
    prvTidyReportAccessError(doc,node,0x2a6);
    return;
  }
  return;
}

Assistant:

static void CheckArea( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    AttVal* av;

    /* Checks all attributes within the AREA element */
    for (av = node->attributes; av != NULL; av = av->next)
    {
        if (Level1_Enabled( doc ))
        {
            /*
              Checks for valid ALT attribute.
              The length of the alt text must be > 4 characters long
              but must be less than 150 characters long.
            */
                
            if ( attrIsALT(av) )
            {
                /* The check for validity */
                if (av->value != NULL) 
                {
                    HasAlt = yes;
                }
            }
        }

        if (Level2_Enabled( doc ))
        {
            if ( attrIsTARGET(av) )
            {
                if (AttrValueIs(av, "_new"))
                {
                    TY_(ReportAccessError)( doc, node, NEW_WINDOWS_REQUIRE_WARNING_NEW);
                }
                else if (AttrValueIs(av, "_blank"))
                {
                    TY_(ReportAccessError)( doc, node, NEW_WINDOWS_REQUIRE_WARNING_BLANK);
                }
            }
        }
    }

    if (Level1_Enabled( doc ))
    {
        /* AREA must contain alt text */
        if (HasAlt == no)
        {
            TY_(ReportAccessError)( doc, node, AREA_MISSING_ALT);
        }    
    }
}